

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceTree.h
# Opt level: O1

void __thiscall Parfait::DistanceTree::DistanceTree(DistanceTree *this,Extent<double> *e)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (this->super_Octree<Parfait::Facet>).max_depth = 5;
  (this->super_Octree<Parfait::Facet>).locked = false;
  (this->super_Octree<Parfait::Facet>).root_extent_set = false;
  *(undefined8 *)&(this->super_Octree<Parfait::Facet>).should_split.super__Function_base._M_functor
       = 0;
  *(undefined8 *)
   ((long)&(this->super_Octree<Parfait::Facet>).should_split.super__Function_base._M_functor + 8) =
       0;
  (this->super_Octree<Parfait::Facet>).should_split.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->super_Octree<Parfait::Facet>).should_split._M_invoker = (_Invoker_type)0x0;
  (this->super_Octree<Parfait::Facet>).voxels.
  super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Octree<Parfait::Facet>).voxels.
  super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Octree<Parfait::Facet>).voxels.
  super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Octree<Parfait::Facet>).objects.
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Octree<Parfait::Facet>).objects.
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Octree<Parfait::Facet>).objects.
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_objects_per_voxel = 0x14;
  dVar7 = (e->hi).pos._M_elems[0];
  dVar1 = (e->lo).pos._M_elems[0];
  dVar2 = (e->lo).pos._M_elems[1];
  dVar8 = (e->hi).pos._M_elems[1];
  dVar6 = (e->hi).pos._M_elems[2];
  dVar3 = (e->lo).pos._M_elems[2];
  dVar4 = (dVar7 + dVar1) * 0.5;
  dVar5 = (dVar8 + dVar2) * 0.5;
  dVar9 = (dVar6 + dVar3) * 0.5;
  dVar7 = dVar7 - dVar1;
  dVar8 = dVar8 - dVar2;
  if (dVar8 <= dVar7) {
    dVar8 = dVar7;
  }
  dVar6 = dVar6 - dVar3;
  if (dVar6 <= dVar8) {
    dVar6 = dVar8;
  }
  dVar6 = dVar6 * 0.5;
  (this->super_Octree<Parfait::Facet>).root_extent.lo.pos._M_elems[0] = dVar4 - dVar6;
  (this->super_Octree<Parfait::Facet>).root_extent.lo.pos._M_elems[1] = dVar5 - dVar6;
  (this->super_Octree<Parfait::Facet>).root_extent.lo.pos._M_elems[2] = dVar9 - dVar6;
  (this->super_Octree<Parfait::Facet>).root_extent.hi.pos._M_elems[0] = dVar4 + dVar6;
  (this->super_Octree<Parfait::Facet>).root_extent.hi.pos._M_elems[1] = dVar5 + dVar6;
  (this->super_Octree<Parfait::Facet>).root_extent.hi.pos._M_elems[2] = dVar6 + dVar9;
  (this->super_Octree<Parfait::Facet>).root_extent_set = true;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(const_std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/T-infinity[P]parfait/parfait/../parfait/DistanceTree.h:82:31)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/T-infinity[P]parfait/parfait/../parfait/DistanceTree.h:82:31)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<bool(std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>&)>::operator=
            ((function<bool(std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>&)> *)
             &(this->super_Octree<Parfait::Facet>).should_split,
             (function<bool_(const_std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&)>
              *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

inline DistanceTree(const Parfait::Extent<double>& e) {
          auto center = (e.hi + e.lo)*0.5;
          double longest_edge = e.hi[0] - e.lo[0];
          longest_edge = std::max(longest_edge, e.hi[1] - e.lo[1]);
          longest_edge = std::max(longest_edge, e.hi[2] - e.lo[2]);
          longest_edge *= 0.5;
          Parfait::Point<double> offset = {longest_edge, longest_edge, longest_edge};
          setRootExtent({center - offset, center + offset});
          auto should_split = [this](const std::vector<Parfait::Facet*>& objects){
              return objects.size() > max_objects_per_voxel;
          };
          setShouldSplit(should_split);
      }